

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool *pbVar1;
  unsigned_long *puVar2;
  pointer pcVar3;
  _Any_data *p_Var4;
  ostream *poVar5;
  result_type seed_00;
  long lVar6;
  uint64_t uVar7;
  bool bVar8;
  undefined1 local_b88 [8];
  RandEngine nextSeed;
  Options options;
  uint64_t local_110;
  optional<unsigned_long> latticeElementSeed;
  uint64_t local_f8;
  optional<unsigned_long> seed;
  string WasmFuzzTypesOption;
  undefined1 local_a0 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  functionName;
  code *local_68;
  code *local_60;
  long *local_58;
  Fuzzer fuzzer;
  long local_48 [2];
  undefined1 local_31 [8];
  bool verbose;
  
  seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = &WasmFuzzTypesOption._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged,"wasm-fuzz-lattices options",""
            );
  puVar2 = nextSeed._M_x + 1;
  local_b88 = (undefined1  [8])puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b88,"wasm-fuzz-lattices","");
  pcVar3 = (pointer)((long)&functionName.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload + 8);
  local_a0 = (undefined1  [8])pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,
             "Fuzz lattices for reflexivity, transitivity, and anti-symmetry, and tranfer functions for monotonicity."
             ,"");
  wasm::Options::Options((Options *)&nextSeed._M_p,(string *)local_b88,(string *)local_a0);
  if (local_a0 != (undefined1  [8])pcVar3) {
    operator_delete((void *)local_a0,
                    functionName.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._M_value._M_string_length + 1);
  }
  if (local_b88 != (undefined1  [8])puVar2) {
    operator_delete((void *)local_b88,nextSeed._M_x[1] + 1);
  }
  seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ = 0;
  local_b88 = (undefined1  [8])puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b88,"--seed","");
  local_a0 = (undefined1  [8])pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"");
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Run a single workload generated by the given seed","");
  bVar8 = (bool)((char)&functionName + ' ');
  functionName.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = &local_f8;
  local_60 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp:1077:15)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp:1077:15)>
             ::_M_manager;
  wasm::Options::add((string *)&nextSeed._M_p,(string *)local_b88,(string *)local_a0,
                     (string *)&local_58,(int)&seed + 8,(function *)0x1,bVar8);
  if (local_68 != (code *)0x0) {
    pbVar1 = &functionName.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged;
    (*local_68)(pbVar1,pbVar1,3);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_a0 != (undefined1  [8])pcVar3) {
    operator_delete((void *)local_a0,
                    functionName.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._M_value._M_string_length + 1);
  }
  if (local_b88 != (undefined1  [8])puVar2) {
    operator_delete((void *)local_b88,nextSeed._M_x[1] + 1);
  }
  latticeElementSeed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ = 0;
  local_b88 = (undefined1  [8])puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b88,"--lattice-element-seed","");
  local_a0 = (undefined1  [8])pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"");
  latticeElementSeed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = argv;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Seed which generated the lattice elements to be checked.","");
  functionName.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = &local_110;
  local_60 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp:1087:15)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp:1087:15)>
             ::_M_manager;
  wasm::Options::add((string *)&nextSeed._M_p,(string *)local_b88,(string *)local_a0,
                     (string *)&local_58,(int)&seed + 8,(function *)0x1,bVar8);
  if (local_68 != (code *)0x0) {
    pbVar1 = &functionName.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged;
    (*local_68)(pbVar1,pbVar1,3);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_a0 != (undefined1  [8])pcVar3) {
    operator_delete((void *)local_a0,
                    functionName.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._M_value._M_string_length + 1);
  }
  if (local_b88 != (undefined1  [8])puVar2) {
    operator_delete((void *)local_b88,nextSeed._M_x[1] + 1);
  }
  functionName.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = 0;
  local_b88 = (undefined1  [8])puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b88,"--function-name","");
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  functionName.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = &local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &functionName.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged,"Name of the function in the module generated by --seed to be checked.",""
            );
  bVar8 = (bool)((char)&WasmFuzzTypesOption + '\x18');
  WasmFuzzTypesOption.field_2._8_8_ = (string *)local_a0;
  wasm::Options::add((string *)&nextSeed._M_p,(string *)local_b88,(string *)&local_58,
                     (string *)
                     &functionName.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_engaged,(int)&seed + 8,(function *)0x1,bVar8);
  p_Var4 = (_Any_data *)((long)&WasmFuzzTypesOption.field_2 + 8);
  std::
  _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp:1098:5)>
  ::_M_manager(p_Var4,p_Var4,__destroy_functor);
  if ((code **)functionName.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._32_8_ != &local_68) {
    operator_delete((void *)functionName.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._32_8_,(ulong)(local_68 + 1));
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_b88 != (undefined1  [8])puVar2) {
    operator_delete((void *)local_b88,nextSeed._M_x[1] + 1);
  }
  local_31[0] = 0;
  local_b88 = (undefined1  [8])puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b88,"--verbose","");
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-v","");
  functionName.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = &local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &functionName.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged,"Print extra information","");
  WasmFuzzTypesOption.field_2._8_8_ = local_31;
  wasm::Options::add((string *)&nextSeed._M_p,(string *)local_b88,(string *)&local_58,
                     (string *)
                     &functionName.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_engaged,(int)&seed + 8,(function *)0x0,bVar8);
  p_Var4 = (_Any_data *)((long)&WasmFuzzTypesOption.field_2 + 8);
  std::
  _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp:1106:15)>
  ::_M_manager(p_Var4,p_Var4,__destroy_functor);
  if ((code **)functionName.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._32_8_ != &local_68) {
    operator_delete((void *)functionName.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._32_8_,(ulong)(local_68 + 1));
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_b88 != (undefined1  [8])puVar2) {
    operator_delete((void *)local_b88,nextSeed._M_x[1] + 1);
  }
  wasm::Options::parse((int)&nextSeed + 0x9c0,(char **)(ulong)(uint)argc);
  local_58 = (long *)CONCAT71(local_58._1_7_,local_31[0]);
  if (seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ != '\x01') {
    local_b88 = (undefined1  [8])wasm::getSeed();
    lVar6 = 1;
    uVar7 = (uint64_t)local_b88;
    do {
      uVar7 = (uVar7 >> 0x3e ^ uVar7) * 0x5851f42d4c957f2d + lVar6;
      nextSeed._M_x[lVar6 + -1] = uVar7;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x138);
    nextSeed._M_x[0x137] = 0x138;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Iteration ",10);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      seed_00 = std::
                mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                ::operator()((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                              *)local_b88);
      wasm::Fuzzer::run((Fuzzer *)&local_58,seed_00,(uint64_t *)0x0,(string *)0x0);
    } while( true );
  }
  if ((latticeElementSeed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ == '\x01') &&
     (functionName.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._24_1_ == '\x01')) {
    wasm::Fuzzer::run((Fuzzer *)&local_58,local_f8,&local_110,(string *)local_a0);
  }
  else {
    wasm::Fuzzer::run((Fuzzer *)&local_58,local_f8,(uint64_t *)0x0,(string *)0x0);
  }
  if ((functionName.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._24_1_ == '\x01') &&
     (functionName.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._24_1_ = 0,
     local_a0 !=
     (undefined1  [8])
     ((long)&functionName.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload + 8))) {
    operator_delete((void *)local_a0,
                    functionName.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._M_value._M_string_length + 1);
  }
  wasm::Options::~Options((Options *)&nextSeed._M_p);
  if ((size_type *)
      seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ != &WasmFuzzTypesOption._M_string_length) {
    operator_delete((void *)seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_long>._8_8_,
                    WasmFuzzTypesOption._M_string_length + 1);
  }
  return 0;
}

Assistant:

int main(int argc, const char* argv[]) {
  using namespace wasm;

  const std::string WasmFuzzTypesOption = "wasm-fuzz-lattices options";

  Options options("wasm-fuzz-lattices",
                  "Fuzz lattices for reflexivity, transitivity, and "
                  "anti-symmetry, and tranfer functions for monotonicity.");

  std::optional<uint64_t> seed;
  options.add("--seed",
              "",
              "Run a single workload generated by the given seed",
              WasmFuzzTypesOption,
              Options::Arguments::One,
              [&](Options*, const std::string& arg) {
                seed = uint64_t(std::stoull(arg));
              });

  std::optional<uint64_t> latticeElementSeed;
  options.add("--lattice-element-seed",
              "",
              "Seed which generated the lattice elements to be checked.",
              WasmFuzzTypesOption,
              Options::Arguments::One,
              [&](Options*, const std::string& arg) {
                latticeElementSeed = uint64_t(std::stoull(arg));
              });

  std::optional<std::string> functionName;
  options.add(
    "--function-name",
    "",
    "Name of the function in the module generated by --seed to be checked.",
    WasmFuzzTypesOption,
    Options::Arguments::One,
    [&](Options*, const std::string& arg) { functionName = arg; });

  bool verbose = false;
  options.add("--verbose",
              "-v",
              "Print extra information",
              WasmFuzzTypesOption,
              Options::Arguments::Zero,
              [&](Options*, const std::string& arg) { verbose = true; });

  options.parse(argc, argv);

  Fuzzer fuzzer{verbose};
  if (seed) {
    if (latticeElementSeed && functionName) {
      // Run test a single function and lattice element seed.
      fuzzer.run(*seed, &(*latticeElementSeed), &(*functionName));
    } else {
      // Run just a single workload with the given seed.
      fuzzer.run(*seed);
    }
  } else {
    // Continuously run workloads with new randomly generated seeds.
    size_t i = 0;
    RandEngine nextSeed(getSeed());
    while (true) {
      std::cout << "Iteration " << ++i << "\n";
      fuzzer.run(nextSeed());
    }
  }
  return 0;
}